

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O1

qulonglong __thiscall QByteArray::toULongLong(QByteArray *this,bool *ok,int base)

{
  QLocaleData *this_00;
  bool bVar1;
  qulonglong qVar2;
  int in_ECX;
  undefined4 in_register_00000014;
  QByteArrayView num;
  QSimpleParsedNumber<unsigned_long_long> QVar3;
  
  num.m_data._4_4_ = in_register_00000014;
  num.m_data._0_4_ = base;
  this_00 = (QLocaleData *)(this->d).size;
  if (this_00 == (QLocaleData *)0x0) {
    bVar1 = true;
    qVar2 = 0;
  }
  else {
    num.m_size = (qsizetype)(this->d).ptr;
    QVar3 = QLocaleData::bytearrayToUnsLongLong(this_00,num,in_ECX);
    bVar1 = QVar3.used < 1;
    qVar2 = 0;
    if (0 < QVar3.used) {
      qVar2 = QVar3.result;
    }
  }
  if (ok != (bool *)0x0) {
    *ok = (bool)(bVar1 ^ 1);
  }
  if (bVar1) {
    qVar2 = 0;
  }
  return qVar2;
}

Assistant:

qulonglong QByteArray::toULongLong(bool *ok, int base) const
{
    return QtPrivate::toIntegral<qulonglong>(qToByteArrayViewIgnoringNull(*this), ok, base);
}